

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O1

int iterdata(long totaln,long offset,long firstn,long nrows,int narray,iteratorCol *iter_col,
            void *usrdata)

{
  double dVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  undefined8 *puVar9;
  char *pcVar10;
  uint uVar11;
  double *pdVar12;
  long lVar13;
  iteratorCol *piVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  if (firstn == 1) {
    iterdata::usrpt = (UserIter *)usrdata;
    iterdata::hdupt = *(FitsHdu **)((long)usrdata + 0x40);
    iterdata::nnum = *usrdata;
    iterdata::ncmp = *(int *)((long)usrdata + 4);
    iterdata::ntxt = *(int *)((long)usrdata + 0x38);
    iterdata::nfloat = *(int *)((long)usrdata + 8);
    iterdata::flag_minmax = (int *)calloc((long)(iterdata::ncmp + iterdata::nnum),4);
    iterdata::repeat = (long *)calloc((long)narray,8);
    iterdata::datatype = (int *)calloc((long)narray,4);
    if (0 < narray) {
      uVar18 = 0;
      piVar14 = iter_col;
      do {
        lVar4 = fits_iter_get_repeat(piVar14);
        iterdata::repeat[uVar18] = lVar4;
        iVar3 = fits_iter_get_datatype(piVar14);
        iterdata::datatype[uVar18] = iVar3;
        uVar18 = uVar18 + 1;
        piVar14 = piVar14 + 1;
      } while ((uint)narray != uVar18);
    }
    iterdata_find_badspace = 0;
    iterdata_find_badlog = '\0';
  }
  uVar11 = iterdata::ncmp + iterdata::nnum;
  uVar18 = (ulong)uVar11;
  if (uVar11 != 0 && SCARRY4(iterdata::ncmp,iterdata::nnum) == (int)uVar11 < 0) {
    lVar4 = 0;
    if (0 < nrows) {
      lVar4 = nrows;
    }
    lVar16 = 0;
    do {
      pvVar5 = fits_iter_get_array(iter_col + lVar16);
      lVar13 = iterdata::repeat[lVar16];
      if ((nrows << (iterdata::nnum <= lVar16) != 0 && lVar13 != 0) &&
         (iterdata::usrpt->indatatyp[lVar16] == 1)) {
        pdVar12 = (double *)((long)pvVar5 + lVar13 * 8);
        lVar17 = 1;
        lVar19 = -8;
        do {
          if (lVar4 + lVar17 == 1) goto LAB_00108302;
          dVar1 = *pdVar12;
          lVar17 = lVar17 + -1;
          pdVar12 = pdVar12 + lVar13;
          lVar19 = lVar19 + 8;
        } while ((iterdata::usrpt->mask[lVar16] & (byte)(int)dVar1) == 0);
        uVar11 = fits_iter_get_colnum(iter_col + lVar16);
        sprintf(errmes,"Row #%ld, and Column #%d: X vector ",firstn - lVar17,(ulong)uVar11);
        lVar13 = iterdata::repeat[lVar16];
        if (0 < lVar13) {
          lVar17 = 0;
          do {
            sprintf(comm,"0x%02x ",
                    (ulong)((int)*(double *)((long)pvVar5 + lVar17 * 8 + lVar13 * lVar19 + 8) & 0xff
                           ));
            strcat(errmes,comm);
            lVar13 = iterdata::repeat[lVar16];
            lVar17 = lVar17 + 1;
          } while (lVar17 < lVar13);
        }
        sVar6 = strlen(errmes);
        builtin_strncpy(errmes + sVar6 + 0xf,"tified.",8);
        builtin_strncpy(errmes + sVar6,"is not l",8);
        builtin_strncpy(errmes + sVar6 + 8,"eft just",8);
        wrterr(iterdata::usrpt->out,errmes,2);
        builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
        print_fmt(iterdata::usrpt->out,errmes,0xd);
      }
LAB_00108302:
      lVar16 = lVar16 + 1;
      uVar18 = (long)iterdata::ncmp + (long)iterdata::nnum;
    } while (lVar16 < (long)uVar18);
  }
  uVar11 = iterdata::ncmp + iterdata::nnum + iterdata::ntxt;
  uVar8 = (ulong)uVar11;
  if ((int)uVar18 < (int)uVar11) {
    lVar4 = (long)(int)uVar18;
    do {
      if (iterdata::datatype[lVar4] == 0x10) {
        if (nrows != 0) {
          pvVar5 = fits_iter_get_array(iter_col + lVar4);
          if (0 < nrows) {
            lVar16 = 0;
            do {
              pcVar7 = *(char **)((long)pvVar5 + lVar16 * 8 + 8);
              cVar2 = *pcVar7;
              while (cVar2 != '\0') {
                pcVar7 = pcVar7 + 1;
                if ((byte)(cVar2 + 0x81U) < 0xa1) {
                  uVar11 = fits_iter_get_colnum(iter_col + lVar4);
                  sprintf(errmes,"String in row #%ld, column #%d contains non-ASCII text.",
                          lVar16 + firstn,(ulong)uVar11);
                  wrterr(iterdata::usrpt->out,errmes,1);
                  builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
                  print_fmt(iterdata::usrpt->out,errmes,0xd);
                  break;
                }
                cVar2 = *pcVar7;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != nrows);
          }
        }
      }
      else if (nrows != 0 && iterdata::repeat[lVar4] != 0) {
        pvVar5 = fits_iter_get_array(iter_col + lVar4);
        if (iterdata_find_badlog == '\0') {
          lVar16 = iterdata::repeat[lVar4];
          lVar13 = lVar16 * nrows;
          if (0 < lVar13) {
            lVar17 = 0;
            do {
              if (2 < *(byte *)((long)pvVar5 + lVar17 + 1)) {
                uVar11 = fits_iter_get_colnum(iter_col + lVar4);
                sprintf(errmes,
                        "Logical value in row #%ld, column #%d not equal to \'T\', \'F\', or 0",
                        (lVar17 + firstn + -1) / lVar16 + 1,(ulong)uVar11);
                wrterr(iterdata::usrpt->out,errmes,1);
                builtin_strncpy(errmes,"             (Other rows may have similar errors).",0x33);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata_find_badlog = '\x01';
                break;
              }
              lVar17 = lVar17 + 1;
            } while (lVar13 - lVar17 != 0);
          }
        }
      }
      lVar4 = lVar4 + 1;
      uVar8 = (long)iterdata::ntxt + (long)iterdata::ncmp + (long)iterdata::nnum;
    } while (lVar4 < (long)uVar8);
  }
  if ((int)uVar8 < iterdata::ncmp + iterdata::nnum + iterdata::ntxt + iterdata::nfloat) {
    lVar4 = (long)(int)uVar8;
    do {
      if (nrows != 0) {
        piVar14 = iter_col + lVar4;
        puVar9 = (undefined8 *)fits_iter_get_array(piVar14);
        iterdata_find_badspace = 0;
        if (0 < nrows) {
          pcVar7 = (char *)*puVar9;
          lVar16 = 0;
          do {
            pcVar15 = (char *)puVar9[lVar16 + 1];
            iVar3 = strcmp(pcVar7,pcVar15);
            if ((iVar3 != 0) && (pcVar10 = strchr(pcVar15,0x2e), pcVar10 == (char *)0x0)) {
              for (; *pcVar15 == ' '; pcVar15 = pcVar15 + 1) {
              }
              if (*pcVar15 != '\0') {
                uVar11 = fits_iter_get_colnum(piVar14);
                sprintf(errmes,"Number in row #%ld, column #%d has no decimal point:",
                        lVar16 + firstn,(ulong)uVar11);
                wrterr(iterdata::usrpt->out,errmes,1);
                strcpy(errmes,pcVar15);
                sVar6 = strlen(errmes);
                builtin_strncpy(errmes + sVar6 + 0x20,"rrors).",8);
                builtin_strncpy(errmes + sVar6,"  (Other",8);
                builtin_strncpy(errmes + sVar6 + 8," rows ma",8);
                builtin_strncpy(errmes + sVar6 + 0x10,"y have s",8);
                builtin_strncpy(errmes + sVar6 + 0x18,"imilar e",8);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                break;
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != nrows);
        }
        if (0 < nrows && (iterdata_find_badspace & 1) == 0) {
          lVar16 = 0;
          do {
            pcVar7 = (char *)puVar9[lVar16 + 1];
            iVar3 = strcmp((char *)*puVar9,pcVar7);
            if (iVar3 != 0) {
              do {
                pcVar15 = pcVar7;
                pcVar7 = pcVar15 + 1;
              } while (*pcVar15 == ' ');
              sVar6 = strlen(pcVar15);
              if (sVar6 != 1 && -1 < (long)(sVar6 - 1)) {
                do {
                  if (pcVar15[sVar6 - 1] != ' ') break;
                  pcVar15[sVar6 - 1] = '\0';
                  sVar6 = sVar6 - 1;
                } while (1 < (long)sVar6);
              }
              pcVar7 = strchr(pcVar15,0x20);
              if (pcVar7 != (char *)0x0) {
                uVar11 = fits_iter_get_colnum(piVar14);
                sprintf(errmes,"Number in row #%ld, column #%d has embedded space:",lVar16 + firstn,
                        (ulong)uVar11);
                wrterr(iterdata::usrpt->out,errmes,1);
                strcpy(errmes,pcVar15);
                sVar6 = strlen(errmes);
                builtin_strncpy(errmes + sVar6 + 0x20,"rrors).",8);
                builtin_strncpy(errmes + sVar6,"  (Other",8);
                builtin_strncpy(errmes + sVar6 + 8," rows ma",8);
                builtin_strncpy(errmes + sVar6 + 0x10,"y have s",8);
                builtin_strncpy(errmes + sVar6 + 0x18,"imilar e",8);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata_find_badspace = 1;
                break;
              }
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != nrows);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)iterdata::nfloat + (long)iterdata::ntxt +
                     (long)iterdata::ncmp + (long)iterdata::nnum);
  }
  if (firstn + nrows + -1 == totaln) {
    free(iterdata::flag_minmax);
    free(iterdata::datatype);
    free(iterdata::repeat);
  }
  return 0;
}

Assistant:

int iterdata(long totaln, 
		 long offset, 
		 long firstn,
		 long nrows,
		 int narray,
		 iteratorCol *iter_col,
		 void *usrdata
		 )
{ 
    static UserIter *usrpt;
    static FitsHdu  *hdupt;
    static int nnum;
    static int ntxt;
    static int ncmp;
    static int nfloat;
    static int *flag_minmax = 0;			/* define the initial min and max value */
    static long *repeat;
    static int *datatype;
    static int find_badbit = 0; 
    static int find_baddot = 0; 
    static int find_badspace = 0; 
    static int find_badchar = 0; 
    static int find_badlog = 0; 

    double  *data;
    unsigned char *ldata;
    char **cdata;
    unsigned char *ucdata;
    char *floatvalue;

    /* bit column working space */
    static unsigned char bdata;

    int i; 
    long j,k,l;
    long nelem;

    int flag_cmpnull = 0;

    if(firstn == 1 ) {  /* first time for this table, so initialize */
        usrpt = (UserIter *)usrdata;
	hdupt= usrpt->hduptr;
        nnum = usrpt->nnum;
        ncmp = usrpt->ncmp;
        ntxt = usrpt->ntxt;
        nfloat = usrpt->nfloat;
	flag_minmax = (int *)calloc(nnum+ncmp, sizeof(int));
	repeat   = (long *)calloc(narray,sizeof(long));
	datatype = (int *)calloc(narray,sizeof(int));
        for (i=0; i < narray; i++) {  
	    repeat[i] = fits_iter_get_repeat(&(iter_col[i]));
	    datatype[i] = fits_iter_get_datatype(&(iter_col[i])); 
        }
        find_badbit = 0; 
        find_baddot = 0; 
        find_badspace = 0; 
        find_badchar = 0; 
        find_badlog = 0; 
    }

    /* columns from  1 to nnum are scalar numerical columns. 
       columns from  nnum+1 to  nnum+ncmp are complex columns. (not used any more)
       columns from  nnum+ncmp are text columns */

    /* deal with the numerical column */
    for (i=0; i < nnum+ncmp; i++) { 
	data = (double *) fits_iter_get_array(&(iter_col[i]));
	j = 1;
	flag_cmpnull = 0;
	nelem = nrows * repeat[i];
	if(i >= nnum) nelem = 2 * nrows *repeat[i];
	if(nelem == 0) continue;
        find_badbit = 0;

        /* check for the bit jurisfication  */
        if(!find_badbit && usrpt->indatatyp[i] == TBIT ) { 
            for (k = 0; k < nrows; k++) {
               j = (k+1)*repeat[i];
               bdata = (unsigned char)data[j]; 
               if( bdata & usrpt->mask[i] ) { 
                  sprintf(errmes, 
                    "Row #%ld, and Column #%d: X vector ", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                  for (l = 1; l<= repeat[i]; l++) {
                     sprintf(comm, "0x%02x ", (unsigned char) data[k*repeat[i]+l]);
                     strcat(errmes,comm); 
                  }
                  strcat(errmes,"is not left justified."); 
                  wrterr(usrpt->out,errmes,2);
                  strcpy(errmes,
          "             (Other rows may have errors).");
                  print_fmt(usrpt->out,errmes,13);
                  find_badbit = 1;
                  break;
               }
            }
        }  
    }

    /* deal with character and logical columns */
    for (i = nnum + ncmp; i < nnum + ncmp + ntxt; i++) { 
        if(datatype[i] == TSTRING ) {	/* character */
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_badchar = 0;

            /* test for illegal ASCII text characters > 126  or < 32 */
            if (!find_badchar) {
              for (k = 0; k < nrows; k++) {
                ucdata = (unsigned char *)cdata[k+1];
                j = 0;
                while (ucdata[j] != 0) {

                  if ((ucdata[j] > 126) || (ucdata[j] < 32)) {
                    sprintf(errmes, 
                    "String in row #%ld, column #%d contains non-ASCII text.", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                      wrterr(usrpt->out,errmes,1);
                      strcpy(errmes,
          "             (Other rows may have errors).");
                      print_fmt(usrpt->out,errmes,13);
                    find_badchar = 1;
                    break;
                  }
                  j++;
                }
              }
            }
        }

	else {  			/* logical value */
            nelem = nrows * repeat[i];
	    if(nelem == 0) continue;
	    ldata = (unsigned char *) fits_iter_get_array(&(iter_col[i]));

            /* test for illegal logical column values */
            /* The first element in the array gives the value that is used to represent nulls */
            if (!find_badlog) {
                for(j = 1; j <= nrows * repeat[i]; j++) {
                  if (ldata[j] > 2) {
                    sprintf(errmes, 
                    "Logical value in row #%ld, column #%d not equal to 'T', 'F', or 0", 
                       (firstn+j - 2)/repeat[i] +1, 
                       fits_iter_get_colnum(&(iter_col[i]))); 
                       wrterr(usrpt->out,errmes,1);
                       strcpy(errmes,
         "             (Other rows may have similar errors).");
                       print_fmt(usrpt->out,errmes,13);
                       find_badlog = 1;
                       break; 
                  }
                }
            }
        }
    }

    for (i = nnum + ncmp +ntxt; i < nnum + ncmp + ntxt + nfloat; i++) { 
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_baddot = 0;
	    find_badspace = 0;

            /* test for missing (implicit) decimal point in floating point numbers */
            if (!find_baddot) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];
                if (strcmp(cdata[0], floatvalue) && !strchr(floatvalue, '.') ) {

		  while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                  if (strlen(floatvalue)) {  /* ignore completely blank fields */
		  
                    sprintf(errmes, 
                     "Number in row #%ld, column #%d has no decimal point:", firstn+k, 
                     fits_iter_get_colnum(&(iter_col[i]))); 
                     wrterr(usrpt->out,errmes,1);
                     strcpy(errmes, floatvalue);
                     strcat(errmes,
                  "  (Other rows may have similar errors).");
                     print_fmt(usrpt->out,errmes,13);
                     find_baddot = 1;
                     break;
                  }
                }
              }
            }

            if (!find_badspace) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];

                if (strcmp(cdata[0], floatvalue) ) {  /* not a null value? */
		    while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                    l = strlen(floatvalue) - 1;
		    while (l > 0 &&  floatvalue[l] == ' ') { /* remove trailing spaces */
		        floatvalue[l] = '\0';
			l--;
		    }

                    if (strchr(floatvalue, ' ') ) {
                      sprintf(errmes, 
                       "Number in row #%ld, column #%d has embedded space:", firstn+k, 
                         fits_iter_get_colnum(&(iter_col[i]))); 
                         wrterr(usrpt->out,errmes,1);
                         strcpy(errmes, floatvalue);
                         strcat(errmes,
                      "  (Other rows may have similar errors).");
                         print_fmt(usrpt->out,errmes,13);
                         find_badspace = 1;
                         break;
                    }
		}
            }
          }
    }

    if(firstn + nrows - 1 == totaln) { 
	free(flag_minmax);
	free(datatype);
	free(repeat); 
    }
    return 0; 
}